

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O0

void __thiscall xe::xml::Writer::Writer(Writer *this,ostream *dst)

{
  ostream *dst_local;
  Writer *this_local;
  
  this->m_rawDst = dst;
  EscapeStreambuf::EscapeStreambuf(&this->m_dataBuf,dst);
  std::ostream::ostream(&this->m_dataStr,&(this->m_dataBuf).super_streambuf);
  this->m_state = STATE_DATA;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_elementStack);
  return;
}

Assistant:

Writer::Writer (std::ostream& dst)
	: m_rawDst	(dst)
	, m_dataBuf	(dst)
	, m_dataStr	(&m_dataBuf)
	, m_state	(STATE_DATA)
{
}